

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O2

Type * slang::ast::getIndexedType
                 (Compilation *compilation,ASTContext *context,Type *valueType,SourceRange exprRange
                 ,SourceRange valueRange,bool isRangeSelect)

{
  bool bVar1;
  Type *pTVar2;
  Diagnostic *pDVar3;
  
  pTVar2 = Type::getCanonicalType(valueType);
  bVar1 = Type::isArray(pTVar2);
  if (bVar1) {
    pTVar2 = Type::getArrayElementType(pTVar2);
    if (((valueType->super_Symbol).kind == PackedArrayType) &&
       (bVar1 = Type::isSigned(valueType), bVar1)) {
      pTVar2 = Type::makeUnsigned(pTVar2,compilation);
      return pTVar2;
    }
  }
  else if ((pTVar2->super_Symbol).kind == StringType && !isRangeSelect) {
    pTVar2 = compilation->byteType;
  }
  else {
    bVar1 = Type::isIntegral(pTVar2);
    if (bVar1) {
      bVar1 = Type::isScalar(pTVar2);
      if (!bVar1) {
        bVar1 = Type::isFourState(pTVar2);
        if (bVar1) {
          return compilation->logicType;
        }
        return compilation->bitType;
      }
      pDVar3 = ASTContext::addDiag(context,(DiagCode)0x370007,exprRange);
      Diagnostic::operator<<(pDVar3,valueRange);
    }
    else {
      bVar1 = Type::isError(pTVar2);
      if (!bVar1) {
        pDVar3 = ASTContext::addDiag(context,(DiagCode)((uint)isRangeSelect * 0x40000 + 0x240007),
                                     exprRange);
        Diagnostic::operator<<(pDVar3,valueRange);
        operator<<(pDVar3,valueType);
      }
    }
    pTVar2 = compilation->errorType;
  }
  return pTVar2;
}

Assistant:

static const Type& getIndexedType(Compilation& compilation, const ASTContext& context,
                                  const Type& valueType, SourceRange exprRange,
                                  SourceRange valueRange, bool isRangeSelect) {
    const Type& ct = valueType.getCanonicalType();
    if (ct.isArray()) {
        auto& elemType = *ct.getArrayElementType();
        if (valueType.kind == SymbolKind::PackedArrayType && valueType.isSigned())
            return elemType.makeUnsigned(compilation);

        return elemType;
    }
    else if (ct.kind == SymbolKind::StringType && !isRangeSelect) {
        return compilation.getByteType();
    }
    else if (!ct.isIntegral()) {
        if (!ct.isError()) {
            auto code = isRangeSelect ? diag::BadSliceType : diag::BadIndexExpression;
            auto& diag = context.addDiag(code, exprRange);
            diag << valueRange;
            diag << valueType;
        }
        return compilation.getErrorType();
    }
    else if (ct.isScalar()) {
        auto& diag = context.addDiag(diag::CannotIndexScalar, exprRange);
        diag << valueRange;
        return compilation.getErrorType();
    }
    else if (ct.isFourState()) {
        return compilation.getLogicType();
    }
    else {
        return compilation.getBitType();
    }
}